

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Minisat::Clause::Clause(Clause *this,vec<Minisat::Lit,_int> *ps,bool use_extra,bool learnt)

{
  uint uVar1;
  Lit *pLVar2;
  int iVar3;
  uint uVar4;
  Clause CVar5;
  undefined7 in_register_00000009;
  int iVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  long lVar8;
  
  iVar6 = (int)CONCAT71(in_register_00000011,use_extra);
  iVar3 = (int)CONCAT71(in_register_00000009,learnt);
  this->header = (anon_struct_4_5_613047fb_for_header)
                 (((uint)this->header & 0xffffffe0) + iVar6 * 8 + iVar3 * 4);
  uVar1 = ps->sz;
  this->header = (anon_struct_4_5_613047fb_for_header)(iVar6 * 8 + iVar3 * 4 | uVar1 << 5);
  if (0 < ps->sz) {
    pLVar2 = ps->data;
    lVar8 = 0;
    do {
      this[lVar8 + 1].header = *(anon_struct_4_5_613047fb_for_header *)(pLVar2 + lVar8);
      lVar8 = lVar8 + 1;
    } while (lVar8 < ps->sz);
  }
  if (use_extra) {
    uVar4 = uVar1 & 0x7ffffff;
    if (learnt) {
      this[(ulong)uVar4 + 1].header = (anon_struct_4_5_613047fb_for_header)0x0;
      return;
    }
    if ((uVar1 & 0x7ffffff) == 0) {
      CVar5.header = (anon_struct_4_5_613047fb_for_header)0x0;
    }
    else {
      uVar7 = 0;
      CVar5.header = (anon_struct_4_5_613047fb_for_header)0x0;
      do {
        CVar5.header = CVar5.header | 1 << (*(byte *)&this[uVar7 + 1].header >> 1 & 0x1f);
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    this[(ulong)uVar4 + 1].header = CVar5.header;
  }
  return;
}

Assistant:

Clause(const vec<Lit>& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();

        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];

        if (header.has_extra){
            if (header.learnt)
                data[header.size].act = 0;
            else
                calcAbstraction();
    }
    }